

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall
wasm::TranslateToFuzzReader::TranslateToFuzzReader
          (TranslateToFuzzReader *this,Module *wasm,string *filename,bool closedWorld)

{
  void *local_40 [2];
  long local_30;
  
  ::wasm::read_file<std::vector<char,std::allocator<char>>>
            ((string *)local_40,(BinaryOption)filename);
  TranslateToFuzzReader(this,wasm,(vector<char,_std::allocator<char>_> *)local_40,closedWorld);
  if (local_40[0] != (void *)0x0) {
    operator_delete(local_40[0],local_30 - (long)local_40[0]);
  }
  return;
}

Assistant:

TranslateToFuzzReader::TranslateToFuzzReader(Module& wasm,
                                             std::string& filename,
                                             bool closedWorld)
  : TranslateToFuzzReader(wasm,
                          read_file<std::vector<char>>(filename, Flags::Binary),
                          closedWorld) {}